

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O0

ObjectUnit * create_objunit(GlobalVars *gv,LinkFile *lf,char *objname)

{
  ObjectUnit *pOVar1;
  Symbol **ppSVar2;
  char *in_RDX;
  LinkFile *in_RSI;
  long in_RDI;
  ObjectUnit *ou;
  size_t in_stack_ffffffffffffffe0;
  
  pOVar1 = (ObjectUnit *)alloc(in_stack_ffffffffffffffe0);
  pOVar1->lnkfile = in_RSI;
  if (in_RDX == (char *)0x0) {
    pOVar1->objname = "";
  }
  else {
    pOVar1->objname = in_RDX;
  }
  initlist(&pOVar1->sections);
  pOVar1->scommon = (Section *)0x0;
  pOVar1->common = (Section *)0x0;
  ppSVar2 = (Symbol **)alloc_hashtable(0x1170fa);
  pOVar1->objsyms = ppSVar2;
  initlist(&pOVar1->stabs);
  initlist(&pOVar1->pripointers);
  pOVar1->flags = 0;
  pOVar1->min_alignment = *(uint8_t *)(in_RDI + 0x9c);
  return pOVar1;
}

Assistant:

struct ObjectUnit *create_objunit(struct GlobalVars *gv,
                                  struct LinkFile *lf,const char *objname)
/* creates and initializes an ObjectUnit node */
{
  struct ObjectUnit *ou = alloc(sizeof(struct ObjectUnit));

  ou->lnkfile = lf;
  if (objname)
    ou->objname = objname;
  else
    ou->objname = noname;
  initlist(&ou->sections);  /* empty section list */
  ou->common = ou->scommon = NULL;
  ou->objsyms = alloc_hashtable(OBJSYMHTABSIZE);
  initlist(&ou->stabs);  /* empty stabs list */
  initlist(&ou->pripointers);  /* empty PriPointer list */
  ou->flags = 0;
  ou->min_alignment = gv->min_alignment;
  return ou;
}